

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O3

void __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::check_invariants(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                   *this)

{
  bool bVar1;
  ulong uVar2;
  int line;
  char *str;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_30;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_20;
  
  bVar1 = pstore::gsl::details::operator<=(&this->pos_,&this->end_);
  if (bVar1) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_20,(this->pos_).span_,(this->pos_).index_);
    uVar2 = pos(this,&local_20);
    line = 0x15c;
    str = "is_valid (pos_)";
    if ((-1 < (long)uVar2) &&
       (uVar2 <= (ulong)((long)(this->buf_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->buf_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start))) {
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_30,(this->end_).span_,(this->end_).index_);
      uVar2 = pos(this,&local_30);
      line = 0x15d;
      str = "is_valid (end_)";
      if ((-1 < (long)uVar2) &&
         (uVar2 <= (ulong)((long)(this->buf_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->buf_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start))) {
        return;
      }
    }
  }
  else {
    line = 0x15b;
    str = "pos_ <= end_";
  }
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                ,line);
}

Assistant:

void buffered_reader<IO, RefillFunction>::check_invariants () noexcept {
#ifndef NDEBUG
            auto is_valid = [this] (gsl::span<std::uint8_t>::iterator it) noexcept {
                ptrdiff_t const p = this->pos (it);
                return p >= 0 &&
                       static_cast<std::make_unsigned<ptrdiff_t>::type> (p) <= buf_.size ();
            };
            PSTORE_ASSERT (pos_ <= end_);
            PSTORE_ASSERT (is_valid (pos_));
            PSTORE_ASSERT (is_valid (end_));
#endif
        }